

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_numerators.hpp
# Opt level: O2

void __thiscall random_numerators<long>::random_numerators(random_numerators<long> *this)

{
  int iVar1;
  time_t tVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  
  this->_length = 0x80000;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  uVar4 = (iVar1 % 3) * 0x400 + this->_length;
  this->_length = uVar4;
  puVar3 = allocate(this,uVar4 * 8);
  this->_pData = puVar3;
  randomize_buffer(this);
  return;
}

Assistant:

random_numerators() {
#if defined(__AVR__)
        // Using 1/8 of free RAM should be enough to fool the 
        // compiler optimizer and give enough test iterations on
        // AVR hardware
        _length = (freeRAM()/8)/sizeof(T);
#else
        _length = 1 << 19;
        // Make sure that the number of iterations is not
        // known at compile time to prevent the compiler
        // from magically calculating results at compile
        // time and hence falsifying the benchmark.        
        srand((unsigned)time(NULL));
        _length += (rand() % 3) * (1 << 10);
#endif 
        _pData = allocate(_length * sizeof(T));

        randomize_buffer();
    }